

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

int __thiscall
kj::
ArrayBuilder<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Entry>
::truncate(ArrayBuilder<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Entry>
           *this,char *__file,__off_t __length)

{
  Entry *pEVar1;
  Entry *pEVar2;
  undefined8 in_RAX;
  undefined8 extraout_RAX;
  
  pEVar1 = this->ptr;
  while (pEVar2 = this->pos, pEVar1 + (long)__file < pEVar2) {
    this->pos = pEVar2 + -1;
    capnp::_::RpcSystemBase::RpcConnectionState::Answer::~Answer(&pEVar2[-1].value);
    in_RAX = extraout_RAX;
  }
  return (int)in_RAX;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }